

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VRINTX_dp(DisasContext_conflict1 *s,arg_VRINTX_dp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 var;
  TCGv_ptr arg2;
  TCGv_i64 tmp;
  TCGv_ptr fpst;
  TCGContext_conflict1 *tcg_ctx;
  arg_VRINTX_dp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpdp_v2(s->isar);
  if (_Var1) {
    _Var1 = isar_feature_aa32_vrint(s->isar);
    if (_Var1) {
      _Var1 = isar_feature_aa32_simd_r32(s->isar);
      if ((_Var1) || (((a->vd | a->vm) & 0x10U) == 0)) {
        _Var1 = vfp_access_check(s);
        if (_Var1) {
          var = tcg_temp_new_i64(tcg_ctx_00);
          neon_load_reg64(tcg_ctx_00,var,a->vm);
          arg2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
          gen_helper_rintd_exact(tcg_ctx_00,var,var,arg2);
          neon_store_reg64(tcg_ctx_00,var,a->vd);
          tcg_temp_free_ptr(tcg_ctx_00,arg2);
          tcg_temp_free_i64(tcg_ctx_00,var);
          s_local._7_1_ = true;
        }
        else {
          s_local._7_1_ = true;
        }
      }
      else {
        s_local._7_1_ = false;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VRINTX_dp(DisasContext *s, arg_VRINTX_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    TCGv_i64 tmp;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_vrint, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((a->vd | a->vm) & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = tcg_temp_new_i64(tcg_ctx);
    neon_load_reg64(tcg_ctx, tmp, a->vm);
    fpst = get_fpstatus_ptr(tcg_ctx, false);
    gen_helper_rintd_exact(tcg_ctx, tmp, tmp, fpst);
    neon_store_reg64(tcg_ctx, tmp, a->vd);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i64(tcg_ctx, tmp);
    return true;
}